

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::GammaCorrection
                  (Image *__return_storage_ptr__,GammaCorrectionForm4 gammaCorrection,Image *in,
                  double a,double gamma)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*gammaCorrection)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
                     __return_storage_ptr__->_height,a,gamma);
  return __return_storage_ptr__;
}

Assistant:

Image GammaCorrection( FunctionTable::GammaCorrectionForm4 gammaCorrection,
                           const Image & in, double a, double gamma )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        gammaCorrection( in, 0, 0, out, 0, 0, out.width(), out.height(), a, gamma );

        return out;
    }